

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O2

uint32_t icu_63::CollationFastLatin::lookup(uint16_t *table,UChar32 c)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  if ((c & 0xffffffc0U) == 0x2000) {
    return (uint32_t)table[(ulong)(uint)c - 0x1e80];
  }
  uVar2 = 1;
  if (c == 0xffff) {
    uVar2 = 0xfca8;
  }
  uVar1 = 3;
  if (c != 0xfffe) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

uint32_t
CollationFastLatin::lookup(const uint16_t *table, UChar32 c) {
    U_ASSERT(c > LATIN_MAX);
    if(PUNCT_START <= c && c < PUNCT_LIMIT) {
        return table[c - PUNCT_START + LATIN_LIMIT];
    } else if(c == 0xfffe) {
        return MERGE_WEIGHT;
    } else if(c == 0xffff) {
        return MAX_SHORT | COMMON_SEC | LOWER_CASE | COMMON_TER;
    } else {
        return BAIL_OUT;
    }
}